

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

bool __thiscall
__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>::operator()
          (_Iter_equals_val<std::__cxx11::string_const> *this,iterator __it)

{
  size_t __n;
  int iVar1;
  
  __n = (*__it.field_1.slot_)->_M_string_length;
  if (__n != (*(undefined8 **)this)[1]) {
    return false;
  }
  if (__n != 0) {
    iVar1 = bcmp(((*__it.field_1.slot_)->_M_dataplus)._M_p,(void *)**(undefined8 **)this,__n);
    return iVar1 == 0;
  }
  return true;
}

Assistant:

static Reference element(slot_type* slot) { return **slot; }